

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O1

void uiInit(Windows *win)

{
  WINDOW *pWVar1;
  
  initscr();
  start_color();
  init_pair(1,7,0);
  noecho();
  curs_set(0);
  if ((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x4f || *(short *)(_stdscr + 4) < 0x17)) {
    quit("Terminal size too small");
  }
  pWVar1 = (WINDOW *)newwin(3,0x50,0,0);
  win->header = pWVar1;
  pWVar1 = (WINDOW *)newwin(0x11,0x50,3,0);
  win->body = pWVar1;
  pWVar1 = (WINDOW *)newwin(4,0x50,0x14,0);
  win->footer = pWVar1;
  pWVar1 = (WINDOW *)newwin(0x18,0x50,0,0);
  win->menu = pWVar1;
  wbkgd(win->body,0x100);
  return;
}

Assistant:

void uiInit(struct Windows *win) {

    int y, x;

    initscr();
    start_color();
    init_pair(1, COLOR_WHITE, COLOR_BLACK);

    noecho(); // hide keypresses
    curs_set(FALSE); // hide cursor

    /* Verify terminal dimensions */
    getmaxyx(stdscr, y, x);
    if ((x < MAX_COLS) || (y < MAX_ROWS)) quit("Terminal size too small");

    /* Set window positions*/
    win->header = newwin(HEADER, MAX_COLS, 0, 0);
    win->body = newwin(MAIN, MAX_COLS, HEADER, 0);
    win->footer = newwin(FOOTER, MAX_COLS, HEADER + MAIN, 0);
    win->menu = newwin(MAX_ROWS, MAX_COLS, 0, 0);
    wbkgd(win->body, COLOR_PAIR (1));
}